

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O3

int SetRudderThrustersFluxSSC32
              (SSC32 *pSSC32,double angle,double urt,double ult,double urf,double ulf)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int pws [32];
  int selectedchannels [32];
  int local_108 [64];
  
  local_108[0x20] = 0;
  local_108[0x21] = 0;
  local_108[0x22] = 0;
  local_108[0x23] = 0;
  local_108[0x24] = 0;
  local_108[0x25] = 0;
  local_108[0x26] = 0;
  local_108[0x27] = 0;
  local_108[0x28] = 0;
  local_108[0x29] = 0;
  local_108[0x2a] = 0;
  local_108[0x2b] = 0;
  local_108[0x2c] = 0;
  local_108[0x2d] = 0;
  local_108[0x2e] = 0;
  local_108[0x2f] = 0;
  local_108[0x30] = 0;
  local_108[0x31] = 0;
  local_108[0x32] = 0;
  local_108[0x33] = 0;
  local_108[0x34] = 0;
  local_108[0x35] = 0;
  local_108[0x36] = 0;
  local_108[0x37] = 0;
  local_108[0x38] = 0;
  local_108[0x39] = 0;
  local_108[0x3a] = 0;
  local_108[0x3b] = 0;
  local_108[0x3c] = 0;
  local_108[0x3d] = 0;
  local_108[0x3e] = 0;
  local_108[0x3f] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[0x10] = 0;
  local_108[0x11] = 0;
  local_108[0x12] = 0;
  local_108[0x13] = 0;
  local_108[0x14] = 0;
  local_108[0x15] = 0;
  local_108[0x16] = 0;
  local_108[0x17] = 0;
  local_108[0x18] = 0;
  local_108[0x19] = 0;
  local_108[0x1a] = 0;
  local_108[0x1b] = 0;
  local_108[0x1c] = 0;
  local_108[0x1d] = 0;
  local_108[0x1e] = 0;
  local_108[0x1f] = 0;
  dVar1 = pSSC32->MidAngle;
  if (0.0 <= angle) {
    dVar8 = pSSC32->MinAngle;
    dVar10 = pSSC32->MaxAngle;
    dVar11 = dVar10 - dVar1;
  }
  else {
    dVar8 = pSSC32->MinAngle;
    dVar10 = pSSC32->MaxAngle;
    dVar11 = dVar1 - dVar8;
  }
  dVar10 = ABS(dVar10);
  dVar12 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar12 = dVar10;
  }
  dVar9 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar9 = dVar10;
  }
  lVar3 = (long)pSSC32->rudderchan;
  local_108[lVar3] = (int)(((dVar1 + (dVar11 * angle) / dVar12) * 500.0) / dVar9) + 0x5dc;
  lVar4 = (long)pSSC32->rightthrusterchan;
  local_108[lVar4] = (int)(urt * 1000.0 * 0.5) + 0x5dc;
  lVar5 = (long)pSSC32->leftthrusterchan;
  local_108[lVar5] = (int)(ult * 1000.0 * 0.5) + 0x5dc;
  lVar6 = (long)pSSC32->rightfluxchan;
  local_108[lVar6] = (int)(urf * 1000.0 * 0.5) + 0x5dc;
  lVar7 = (long)pSSC32->leftfluxchan;
  local_108[lVar7] = (int)(ulf * 1000.0 * 0.5) + 0x5dc;
  iVar2 = local_108[lVar3];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_108[lVar3] = iVar2;
  iVar2 = local_108[lVar4];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_108[lVar4] = iVar2;
  iVar2 = local_108[lVar5];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_108[lVar5] = iVar2;
  iVar2 = local_108[lVar6];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_108[lVar6] = iVar2;
  iVar2 = 2000;
  if (local_108[lVar7] < 2000) {
    iVar2 = local_108[lVar7];
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_108[lVar7] = iVar2;
  local_108[lVar3 + 0x20] = 1;
  local_108[lVar4 + 0x20] = 1;
  local_108[lVar5 + 0x20] = 1;
  local_108[lVar6 + 0x20] = 1;
  local_108[lVar7 + 0x20] = 1;
  iVar2 = SetAllPWMsSSC32(pSSC32,local_108 + 0x20,local_108);
  return iVar2;
}

Assistant:

inline int SetRudderThrustersFluxSSC32(SSC32* pSSC32, double angle, double urt, double ult, double urf, double ulf)
{
	int selectedchannels[NB_CHANNELS_PWM_SSC32];
	int pws[NB_CHANNELS_PWM_SSC32];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into SSC32 pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pSSC32->MidAngle+angle*(pSSC32->MaxAngle-pSSC32->MidAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)): pSSC32->MidAngle+angle*(pSSC32->MidAngle-pSSC32->MinAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle));
	//angletmp = angle >= 0? pSSC32->MidAngle+urudder*(pSSC32->MaxAngle-pSSC32->MidAngle): pSSC32->MidAngle+urudder*(pSSC32->MidAngle-pSSC32->MinAngle);
	if (angletmp >= 0)
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
	else
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MID_PW_SSC32-DEFAULT_MIN_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
#else
	pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angle*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)
		/(pSSC32->MaxAngle-pSSC32->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into SSC32 pulse width (in us).
	pws[pSSC32->rightthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(urt*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(ult*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->rightfluxchan] = DEFAULT_MID_PW_SSC32+(int)(urf*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftfluxchan] = DEFAULT_MID_PW_SSC32+(int)(ulf*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);

	pws[pSSC32->rudderchan] = max(min(pws[pSSC32->rudderchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightthrusterchan] = max(min(pws[pSSC32->rightthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftthrusterchan] = max(min(pws[pSSC32->leftthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightfluxchan] = max(min(pws[pSSC32->rightfluxchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftfluxchan] = max(min(pws[pSSC32->leftfluxchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	selectedchannels[pSSC32->rudderchan] = 1;
	selectedchannels[pSSC32->rightthrusterchan] = 1;
	selectedchannels[pSSC32->leftthrusterchan] = 1;
	selectedchannels[pSSC32->rightfluxchan] = 1;
	selectedchannels[pSSC32->leftfluxchan] = 1;

	return SetAllPWMsSSC32(pSSC32, selectedchannels, pws);
}